

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

void Scl_LibertyDumpTables(Vec_Str_t *vOut,Vec_Flt_t *vInd1,Vec_Flt_t *vInd2,Vec_Flt_t *vValues)

{
  int iVar1;
  long lVar2;
  
  Vec_StrPutI_(vOut,vInd1->nSize);
  if (0 < vInd1->nSize) {
    lVar2 = 0;
    do {
      Vec_StrPutF_(vOut,vInd1->pArray[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < vInd1->nSize);
  }
  Vec_StrPutI_(vOut,vInd2->nSize);
  iVar1 = vInd2->nSize;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      Vec_StrPutF_(vOut,vInd2->pArray[lVar2]);
      lVar2 = lVar2 + 1;
      iVar1 = vInd2->nSize;
    } while (lVar2 < iVar1);
  }
  if (iVar1 * vInd1->nSize == vValues->nSize) {
    if (0 < vValues->nSize) {
      lVar2 = 0;
      do {
        Vec_StrPutF_(vOut,vValues->pArray[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < vValues->nSize);
    }
    iVar1 = 3;
    do {
      Vec_StrPutF_(vOut,0.0);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 4;
    do {
      Vec_StrPutF_(vOut,0.0);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 6;
    do {
      Vec_StrPutF_(vOut,0.0);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    return;
  }
  __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                ,0x3e6,
                "void Scl_LibertyDumpTables(Vec_Str_t *, Vec_Flt_t *, Vec_Flt_t *, Vec_Flt_t *)");
}

Assistant:

void Scl_LibertyDumpTables( Vec_Str_t * vOut, Vec_Flt_t * vInd1, Vec_Flt_t * vInd2, Vec_Flt_t * vValues )
{
    int i; float Entry;
    // write entries
    Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
    Vec_FltForEachEntry( vInd1, Entry, i )
        Vec_StrPutF_( vOut, Entry );
    Vec_StrPut_( vOut );
    // write entries
    Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
    Vec_FltForEachEntry( vInd2, Entry, i )
        Vec_StrPutF_( vOut, Entry );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    // write entries
    assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
    Vec_FltForEachEntry( vValues, Entry, i )
    {
        Vec_StrPutF_( vOut, Entry );
        if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
            Vec_StrPut_( vOut );
    }
    // dump approximations
    Vec_StrPut_( vOut );
    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
}